

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::SwitchRepresentations
          (CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint i;
  ulong uVar6;
  Char aCStack_30 [4];
  Char existCs [4];
  
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x35f,"(IsCompact())","IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetCompactLength(this);
  if (uVar3 < 5) {
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      uVar4 = GetCompactCharU(this,(uint)uVar6);
      aCStack_30[uVar6] = (Char)uVar4;
    }
    (this->rep).compact.countPlusOne = 0;
    CharBitvec::Clear(&(this->rep).full.direct);
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      Set(this,allocator,aCStack_30[uVar6]);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SwitchRepresentations(ArenaAllocator* allocator)
    {
        Assert(IsCompact());
        uint existCount = this->GetCompactLength();
        __assume(existCount <= MaxCompact);
        if (existCount <= MaxCompact)
        {
            Char existCs[MaxCompact];
            for (uint i = 0; i < existCount; i++)
            {
                existCs[i] = GetCompactChar(i);
            }
            rep.full.root = nullptr;
            rep.full.direct.Clear();
            for (uint i = 0; i < existCount; i++)
                Set(allocator, existCs[i]);
        }
    }